

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O2

int Am_Font_Data::remove(char *__filename)

{
  Am_Font_Data *pAVar1;
  Font_Index *pFVar2;
  Display *pDVar3;
  Font_Index **in_RAX;
  Font_Index **extraout_RAX;
  Font_Index *pFVar4;
  Font_Index **ppFVar5;
  Am_Font_Data **ppAVar6;
  
  ppAVar6 = &list;
  do {
    pAVar1 = *ppAVar6;
    if (pAVar1 == (Am_Font_Data *)0x0) {
      return (int)in_RAX;
    }
    if (pAVar1->main_display == (Display *)__filename) {
      XFreeFont(pAVar1->main_display,pAVar1->main_xfont);
      pAVar1->main_display = (Display *)0x0;
    }
    in_RAX = &pAVar1->font_head;
    pFVar4 = (Font_Index *)0x0;
    ppFVar5 = in_RAX;
    while (pFVar2 = *ppFVar5, pFVar2 != (Font_Index *)0x0) {
      pDVar3 = pFVar2->dpy;
      if (pDVar3 == (Display *)__filename) {
        ppFVar5 = &pFVar4->next;
        if (pFVar4 == (Font_Index *)0x0) {
          ppFVar5 = in_RAX;
        }
        *ppFVar5 = pFVar2->next;
        XFreeFont(pDVar3,pFVar2->xfont);
        operator_delete(pFVar2);
        in_RAX = extraout_RAX;
        break;
      }
      pFVar4 = pFVar2;
      ppFVar5 = &pFVar2->next;
    }
    ppAVar6 = &pAVar1->next;
  } while( true );
}

Assistant:

void
Am_Font_Data::remove(Display *display)
{
  Am_Font_Data *curr;
  for (curr = list; curr; curr = curr->next) {
    if (curr->main_display == display) {
      XFreeFont(curr->main_display, curr->main_xfont);
      curr->main_display = nullptr;
    }
    Font_Index *prev = nullptr;
    Font_Index *curr_index = curr->font_head;
    while (curr_index) {
      if (curr_index->dpy == display) {
        if (prev)
          prev->next = curr_index->next;
        else
          curr->font_head = curr_index->next;
        XFreeFont(curr_index->dpy, curr_index->xfont);
        delete curr_index;
        break;
      }
      prev = curr_index;
      curr_index = curr_index->next;
    }
  }
}